

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitRefTest(BinaryInstWriter *this,RefTest *curr)

{
  BufferWithRandomAccess *pBVar1;
  WasmBinaryWriter *this_00;
  bool bVar2;
  Exactness exactness;
  HeapType type;
  U32LEB local_20;
  U32LEB local_1c;
  RefTest *local_18;
  RefTest *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (RefTest *)this;
  BufferWithRandomAccess::operator<<(this->o,-5);
  bVar2 = wasm::Type::isNullable(&local_18->castType);
  if (bVar2) {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x15);
    BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  }
  else {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0x14);
    BufferWithRandomAccess::operator<<(pBVar1,local_20);
  }
  this_00 = this->parent;
  type = wasm::Type::getHeapType(&local_18->castType);
  exactness = wasm::Type::getExactness(&local_18->castType);
  WasmBinaryWriter::writeHeapType(this_00,type,exactness);
  return;
}

Assistant:

void BinaryInstWriter::visitRefTest(RefTest* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  if (curr->castType.isNullable()) {
    o << U32LEB(BinaryConsts::RefTestNull);
  } else {
    o << U32LEB(BinaryConsts::RefTest);
  }
  parent.writeHeapType(curr->castType.getHeapType(),
                       curr->castType.getExactness());
}